

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeSetAutoVacuum(Btree *p,int autoVacuum)

{
  long lVar1;
  char in_SIL;
  long in_RDI;
  u8 av;
  int rc;
  BtShared *pBt;
  int local_1c;
  
  lVar1 = *(long *)(in_RDI + 8);
  local_1c = 0;
  sqlite3BtreeEnter((Btree *)0x1a0d95);
  if (((*(ushort *)(lVar1 + 0x28) & 2) == 0) || ((in_SIL != '\0') == (bool)*(char *)(lVar1 + 0x21)))
  {
    *(bool *)(lVar1 + 0x21) = in_SIL != '\0';
    *(bool *)(lVar1 + 0x22) = in_SIL == '\x02';
  }
  else {
    local_1c = 8;
  }
  sqlite3BtreeLeave((Btree *)0x1a0e11);
  return local_1c;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetAutoVacuum(Btree *p, int autoVacuum){
#ifdef SQLITE_OMIT_AUTOVACUUM
  return SQLITE_READONLY;
#else
  BtShared *pBt = p->pBt;
  int rc = SQLITE_OK;
  u8 av = (u8)autoVacuum;

  sqlite3BtreeEnter(p);
  if( (pBt->btsFlags & BTS_PAGESIZE_FIXED)!=0 && (av ?1:0)!=pBt->autoVacuum ){
    rc = SQLITE_READONLY;
  }else{
    pBt->autoVacuum = av ?1:0;
    pBt->incrVacuum = av==2 ?1:0;
  }
  sqlite3BtreeLeave(p);
  return rc;
#endif
}